

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateArenaString
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined8 *puVar5;
  long *plVar6;
  LogMessage *pLVar7;
  Options *in_RCX;
  size_type *psVar8;
  FieldDescriptor *pFVar9;
  undefined8 uVar10;
  string default_string;
  size_type __dnew;
  undefined1 local_e8 [56];
  FieldDescriptor *local_b0;
  FieldDescriptor *local_a8;
  FieldDescriptor *local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 local_50 [32];
  
  FVar1 = field[1];
  pFVar9 = field;
  if (((byte)FVar1 & 2) == 0) {
    in_RCX = (Options *)(CONCAT71((int7)((ulong)in_RAX >> 8),FVar1) & 0xffffff60);
    if (((char)in_RCX == ' ') &&
       (pFVar9 = *(FieldDescriptor **)(field + 0x10), pFVar9[0x3a] == (FieldDescriptor)0x2)) {
      if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(field + 0x28) == 0)) goto LAB_002b55d3;
    }
    else if ((char)in_RCX == '@') goto LAB_002b55d3;
  }
  else {
LAB_002b55d3:
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\0') {
      FieldName_abi_cxx11_((string *)local_e8,(cpp *)field,pFVar9);
      Formatter::operator()
                (format,"_Internal::set_has_$1$(&$has_bits$);\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_);
      }
    }
  }
  if (*(long *)(*(long *)(field + 0x40) + 8) == 0) {
    local_50._0_8_ = (FieldDescriptor *)0x15;
    local_b0 = (FieldDescriptor *)&local_a0;
    local_b0 = (FieldDescriptor *)
               std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)local_50);
    local_a0 = (FieldDescriptor *)local_50._0_8_;
    *(undefined8 *)local_b0 = 0x4655424f544f5250;
    *(undefined8 *)(local_b0 + 8) = 0x415053454d414e5f;
    *(undefined8 *)(local_b0 + 0xd) = 0x44495f4543415053;
    local_a8 = (FieldDescriptor *)local_50._0_8_;
    local_b0[local_50._0_8_] = (FieldDescriptor)0x0;
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x40eef8);
    psVar8 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar8) {
      local_e8._16_8_ = *psVar8;
      local_e8._24_8_ = puVar5[3];
      local_e8._0_8_ = local_e8 + 0x10;
    }
    else {
      local_e8._16_8_ = *psVar8;
      local_e8._0_8_ = (size_type *)*puVar5;
    }
    local_e8._8_8_ = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append(local_e8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = puVar5[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_90._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
    pFVar9 = local_b0;
    if (local_b0 == (FieldDescriptor *)&local_a0) goto LAB_002b5892;
  }
  else {
    QualifiedClassName_abi_cxx11_
              ((string *)local_50,*(cpp **)(field + 0x20),(Descriptor *)this->options_,in_RCX);
    puVar5 = (undefined8 *)std::__cxx11::string::append(local_50);
    pFVar9 = (FieldDescriptor *)(puVar5 + 2);
    if ((FieldDescriptor *)*puVar5 == pFVar9) {
      local_a0 = *(FieldDescriptor **)pFVar9;
      uStack_98 = puVar5[3];
      local_b0 = (FieldDescriptor *)&local_a0;
    }
    else {
      local_a0 = *(FieldDescriptor **)pFVar9;
      local_b0 = (FieldDescriptor *)*puVar5;
    }
    local_a8 = (FieldDescriptor *)puVar5[1];
    *puVar5 = pFVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    MakeDefaultName_abi_cxx11_(&local_70,(cpp *)field,local_a8);
    pFVar9 = (FieldDescriptor *)0xf;
    if (local_b0 != (FieldDescriptor *)&local_a0) {
      pFVar9 = local_a0;
    }
    if (pFVar9 < local_a8 + local_70._M_string_length) {
      uVar10 = (FieldDescriptor *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar10 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_a8 + local_70._M_string_length) goto LAB_002b5790;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_002b5790:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    }
    local_e8._0_8_ = local_e8 + 0x10;
    psVar8 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar8) {
      local_e8._16_8_ = *psVar8;
      local_e8._24_8_ = puVar5[3];
    }
    else {
      local_e8._16_8_ = *psVar8;
      local_e8._0_8_ = (size_type *)*puVar5;
    }
    local_e8._8_8_ = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(char *)psVar8 = '\0';
    plVar6 = (long *)std::__cxx11::string::append(local_e8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90.field_2._8_8_ = plVar6[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar8;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_b0 != (FieldDescriptor *)&local_a0) {
      operator_delete(local_b0);
    }
    pFVar9 = (FieldDescriptor *)local_50._0_8_;
    if ((FieldDescriptor *)local_50._0_8_ == (FieldDescriptor *)(local_50 + 0x10))
    goto LAB_002b5892;
  }
  operator_delete(pFVar9);
LAB_002b5892:
  Formatter::operator()<>
            (format,
             "if (arena != nullptr) {\n  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  bVar3 = IsStringInlined(field,this->options_);
  if (bVar3) {
    if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27d);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)local_e8,"CHECK failed: !inlined_string_indices_.empty(): ")
      ;
      internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    }
    if (((byte)field[1] & 8) == 0) {
      plVar6 = (long *)(*(long *)(field + 0x20) + 0x28);
    }
    else if (*(long *)(field + 0x28) == 0) {
      plVar6 = (long *)(*(long *)(field + 0x10) + 0x70);
    }
    else {
      plVar6 = (long *)(*(long *)(field + 0x28) + 0x50);
    }
    iVar2 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)((ulong)((long)field - *plVar6) >> 3) * 0x38e38e39];
    if (iVar2 < 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x27f);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)local_e8,"CHECK failed: (inlined_string_index) >= (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)local_e8);
    }
    iVar4 = iVar2 + 0x1f;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    local_e8._0_8_ = 1L << ((byte)iVar2 & 0x1f);
    local_b0 = (FieldDescriptor *)CONCAT44(local_b0._4_4_,iVar4 >> 5);
    local_e8._8_4_ = 8;
    Formatter::operator()
              (format,
               ", $msg$_internal_$name$_donated(), &$msg$_inlined_string_donated_[$1$], ~0x$2$u",
               (int *)&local_b0,(Hex *)local_e8);
  }
  else if (*(long *)(*(long *)(field + 0x40) + 8) != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x287);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)local_e8,
                        "CHECK failed: field->default_value_string().empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)local_e8);
  }
  Formatter::operator()
            (format,
             ");\n} else {\n  ptr = ::$proto_ns$::internal::InlineGreedyStringParser($msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n}\nconst std::string* str = &$msg$$name$_.Get(); (void)str;\n"
             ,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateArenaString(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (HasHasbit(field)) {
    format("_Internal::set_has_$1$(&$has_bits$);\n", FieldName(field));
  }
  std::string default_string =
      field->default_value_string().empty()
          ? "::" + ProtobufNamespace(options_) +
                "::internal::GetEmptyStringAlreadyInited()"
          : QualifiedClassName(field->containing_type(), options_) +
                "::" + MakeDefaultName(field) + ".get()";
  format(
      "if (arena != nullptr) {\n"
      "  ptr = ctx->ReadArenaString(ptr, &$msg$$name$_, arena");
  if (IsStringInlined(field, options_)) {
    GOOGLE_DCHECK(!inlined_string_indices_.empty());
    int inlined_string_index = inlined_string_indices_[field->index()];
    GOOGLE_DCHECK_GE(inlined_string_index, 0);
    format(
        ", $msg$_internal_$name$_donated()"
        ", &$msg$_inlined_string_donated_[$1$]"
        ", ~0x$2$u",
        inlined_string_index / 32,
        strings::Hex(1u << (inlined_string_index % 32), strings::ZERO_PAD_8));
  } else {
    GOOGLE_DCHECK(field->default_value_string().empty());
  }
  format(
      ");\n"
      "} else {\n"
      "  ptr = ::$proto_ns$::internal::InlineGreedyStringParser("
      "$msg$$name$_.MutableNoArenaNoDefault(&$1$), ptr, ctx);\n"
      "}\n"
      "const std::string* str = &$msg$$name$_.Get(); (void)str;\n",
      default_string);
}